

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

void * list_get(List *list,uint index)

{
  ListNode *pLVar1;
  int iVar2;
  
  if ((index < list->size) && (pLVar1 = list->head, pLVar1 != (ListNode *)0x0)) {
    iVar2 = index + 1;
    do {
      iVar2 = iVar2 + -1;
      if (iVar2 == 0) goto LAB_00102c3d;
      pLVar1 = pLVar1->next;
    } while (pLVar1 != (list_node_ *)0x0);
  }
  pLVar1 = (ListNode *)0x0;
LAB_00102c3d:
  if (pLVar1 != (ListNode *)0x0) {
    return pLVar1->data;
  }
  return (void *)0x0;
}

Assistant:

ListNode* list_get_(List * list, unsigned int index){
    if (index >= list->size || index < 0){
        return NULL;
    }
    int tmp = 0;
    ListNode *curNode = list->head;
    while (curNode != NULL){
        if (tmp == index){
            return curNode;
        }
        tmp++;
        curNode = curNode->next;
    }
    return NULL;
}